

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGenerators::ListQt5RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,cmTarget *target
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *depends)

{
  pointer *ppbVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  istream *piVar6;
  ulong uVar7;
  long lVar8;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_510;
  const_iterator local_508;
  value_type local_500;
  long local_4e0;
  size_type sz;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  string local_4a8;
  undefined1 local_488 [8];
  string eline;
  istringstream estr;
  string local_2e8;
  undefined1 local_2c8 [8];
  string oline;
  istringstream ostr;
  int local_11c;
  undefined1 local_118 [3];
  bool result;
  int retVal;
  string rccStdErr;
  string rccStdOut;
  string absFile;
  value_type local_b0;
  undefined1 local_80 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qrcEntries;
  string rccCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmTarget *target_local;
  cmSourceFile *sf_local;
  cmQtAutoGenerators *this_local;
  
  ppbVar1 = &qrcEntries.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  GetRccExecutable_abi_cxx11_((string *)ppbVar1,this,target);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&command.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80,(value_type *)ppbVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"--list",(allocator *)(absFile.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(absFile.field_2._M_local_buf + 0xf));
  psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  cmsys::SystemTools::GetRealPath((string *)((long)&rccStdOut.field_2 + 8),psVar4,(string *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80,(value_type *)((long)&rccStdOut.field_2 + 8));
  std::__cxx11::string::string((string *)(rccStdErr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_118);
  local_11c = 0;
  bVar2 = cmSystemTools::RunSingleCommand
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_80,(string *)(rccStdErr.field_2._M_local_buf + 8),(string *)local_118,
                     &local_11c,(char *)0x0,OUTPUT_NONE,0.0);
  if ((bVar2) && (local_11c == 0)) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(oline.field_2._M_local_buf + 8),
               (string *)(rccStdErr.field_2._M_local_buf + 8),_S_in);
    std::__cxx11::string::string((string *)local_2c8);
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(oline.field_2._M_local_buf + 8),(string *)local_2c8);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      cmQtAutoGeneratorsStripCR(&local_2e8,(string *)local_2c8);
      std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&command.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2c8);
      }
    }
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::istringstream::~istringstream((istringstream *)(oline.field_2._M_local_buf + 8));
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(eline.field_2._M_local_buf + 8),(string *)local_118,_S_in);
    std::__cxx11::string::string((string *)local_488);
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(eline.field_2._M_local_buf + 8),(string *)local_488);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      cmQtAutoGeneratorsStripCR(&local_4a8,(string *)local_488);
      std::__cxx11::string::operator=((string *)local_488,(string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::string((string *)&local_4c8,(string *)local_488);
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        (&local_4c8,(char (*) [14])"RCC: Error in");
      std::__cxx11::string::~string((string *)&local_4c8);
      if (bVar2) {
        if ((ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
             ::searchString_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                         ::searchString_abi_cxx11_), iVar3 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)
                     &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                      ::searchString_abi_cxx11_,"Cannot find file \'",(allocator *)((long)&pos + 7))
          ;
          std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
          __cxa_atexit(std::__cxx11::string::~string,
                       &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::searchString_abi_cxx11_);
        }
        sz = std::__cxx11::string::find((string *)local_488,0xa5f320);
        if (sz == 0xffffffffffffffff) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "AUTOGEN: error: Rcc lists unparsable output ");
          poVar5 = std::operator<<(poVar5,(string *)local_488);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          bVar2 = true;
          goto LAB_006ca551;
        }
        lVar8 = std::__cxx11::string::length();
        sz = sz + lVar8;
        local_4e0 = std::__cxx11::string::size();
        local_4e0 = ~sz + local_4e0;
        std::__cxx11::string::substr((ulong)&local_500,(ulong)local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&command.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_500);
        std::__cxx11::string::~string((string *)&local_500);
      }
    }
    bVar2 = false;
LAB_006ca551:
    std::__cxx11::string::~string((string *)local_488);
    std::__cxx11::istringstream::~istringstream((istringstream *)(eline.field_2._M_local_buf + 8));
    if (!bVar2) {
      local_510._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(depends);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_508,&local_510);
      ppbVar1 = &command.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)ppbVar1);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppbVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends,
                 local_508,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__first._M_current,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&command.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,"@list_sep@");
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: Rcc list process for ");
    psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5," failed:\n");
    poVar5 = std::operator<<(poVar5,(string *)(rccStdErr.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,(string *)local_118);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)(rccStdErr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rccStdOut.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&command.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &qrcEntries.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt5RccInputs(cmSourceFile* sf,
                                            cmTarget const* target,
                                            std::vector<std::string>& depends)
{
  std::string rccCommand = this->GetRccExecutable(target);
  std::vector<std::string> qrcEntries;

  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back("--list");

  std::string absFile = cmsys::SystemTools::GetRealPath(
                                              sf->GetFullPath());

  command.push_back(absFile);

  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (!result || retVal)
    {
    std::cerr << "AUTOGEN: error: Rcc list process for " << sf->GetFullPath()
              << " failed:\n" << rccStdOut << "\n" << rccStdErr << std::endl;
    return std::string();
    }

  {
  std::istringstream ostr(rccStdOut);
  std::string oline;
  while(std::getline(ostr, oline))
    {
    oline = cmQtAutoGeneratorsStripCR(oline);
    if(!oline.empty())
      {
      qrcEntries.push_back(oline);
      }
    }
  }

  {
  std::istringstream estr(rccStdErr);
  std::string eline;
  while(std::getline(estr, eline))
    {
    eline = cmQtAutoGeneratorsStripCR(eline);
    if (cmHasLiteralPrefix(eline, "RCC: Error in"))
      {
      static std::string searchString = "Cannot find file '";

      std::string::size_type pos = eline.find(searchString);
      if (pos == std::string::npos)
        {
        std::cerr << "AUTOGEN: error: Rcc lists unparsable output "
                  << eline << std::endl;
        return std::string();
        }
      pos += searchString.length();
      std::string::size_type sz = eline.size() - pos - 1;
      qrcEntries.push_back(eline.substr(pos, sz));
      }
    }
  }

  depends.insert(depends.end(), qrcEntries.begin(), qrcEntries.end());
  return cmJoin(qrcEntries, "@list_sep@");
}